

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

void * yang_read_range(lys_module *module,yang_type *stype,char *value,int is_ext_instance)

{
  lys_type *plVar1;
  char *pcVar2;
  LY_ERR *pLVar3;
  
  if (is_ext_instance == 0) {
    if ((stype->base & ~LY_TYPE_DEC64) == LY_TYPE_DER) {
      stype->base = LY_TYPE_DEC64;
      plVar1 = stype->type;
      if ((plVar1->info).bits.bit == (lys_type_bit *)0x0) {
        stype = (yang_type *)calloc(1,0x38);
        if ((lys_type_bit *)stype != (lys_type_bit *)0x0) {
          (plVar1->info).bits.bit = (lys_type_bit *)stype;
          goto LAB_0014e0ae;
        }
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_range");
      }
      else {
        ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,"range","type");
      }
    }
    else {
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Unexpected range statement.");
    }
    free(value);
    stype = (yang_type *)0x0;
  }
  else {
LAB_0014e0ae:
    pcVar2 = lydict_insert_zc(module->ctx,value);
    ((lys_type_bit *)stype)->name = pcVar2;
  }
  return (lys_type_bit *)stype;
}

Assistant:

void *
yang_read_range(struct  lys_module *module, struct yang_type *stype, char *value, int is_ext_instance)
{
    struct lys_restr * range;

    if (is_ext_instance) {
        range = (struct lys_restr *)stype;
    } else {
        if (stype->base != 0 && stype->base != LY_TYPE_DEC64) {
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Unexpected range statement.");
            goto error;
        }
        stype->base = LY_TYPE_DEC64;
        if (stype->type->info.dec64.range) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "range", "type");
            goto error;
        }
        range = calloc(1, sizeof *range);
        if (!range) {
            LOGMEM;
            goto error;
        }
        stype->type->info.dec64.range = range;
    }
    range->expr = lydict_insert_zc(module->ctx, value);
    return range;

error:
    free(value);
    return NULL;
}